

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExampleKeyboardAndMouse.cpp
# Opt level: O1

void __thiscall Application::~Application(Application *this)

{
  DisplayInterface *pDVar1;
  
  (this->super_Listener)._vptr_Listener = (_func_int **)&PTR__Application_0010e408;
  (this->display).super_DisplayInterface._vptr_DisplayInterface =
       (_func_int **)&PTR__Display_0010e4a0;
  pDVar1 = (this->display).internal;
  if (pDVar1 != (DisplayInterface *)0x0) {
    (*pDVar1->_vptr_DisplayInterface[1])();
    (this->display).internal = (DisplayInterface *)0x0;
  }
  operator_delete(this);
  return;
}

Assistant:

int run()
    {
        const int width  = 320;
        const int height = 240;

        display.listener(this);

        if (!display.open("Keyboard and Mouse Example", width, height))
            return 1;

        vector<Pixel> pixels(width * height);

        while (display.open())
        {
            unsigned int index = 0;

            for (int y = 0; y < height; ++y)
            {
                for (int x = 0; x < width; ++x)
                {
                    pixels[index].r = 0.3f + (x + y) * 0.00125f;
                    pixels[index].g = 0.7f + (x + y) * 0.001f;
                    pixels[index].b = 0.5f + (x + y) * 0.0008f;

                    ++index;
                }
            }

#ifdef PIXELTOASTER_NO_STL
            display.update(pixels.data());
#else
            display.update(pixels);
#endif
        }

        return 0;
    }